

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O2

void __thiscall slang::analysis::ClockVisitor::checkGFSVC(ClockVisitor *this)

{
  Diagnostic *this_00;
  string_view arg;
  
  if (((this->bad == false) && (this->globalFutureSampledValueCall != (CallExpression *)0x0)) &&
     (this->hasMatchItems == true)) {
    this->bad = true;
    this_00 = AnalysisContext::addDiag
                        (this->context,this->parentSymbol,(DiagCode)0x2000e,
                         (this->globalFutureSampledValueCall->super_Expression).sourceRange);
    arg = ast::CallExpression::getSubroutineName(this->globalFutureSampledValueCall);
    Diagnostic::operator<<(this_00,arg);
    return;
  }
  return;
}

Assistant:

void checkGFSVC() {
        if (!bad && globalFutureSampledValueCall && hasMatchItems) {
            bad = true;

            auto& diag = context.addDiag(parentSymbol, diag::GFSVMatchItems,
                                         globalFutureSampledValueCall->sourceRange);
            diag << globalFutureSampledValueCall->getSubroutineName();
        }
    }